

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::SolveBeforeConstraintSyntax::setChild
          (SolveBeforeConstraintSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *pSVar2;
  logic_error *this_00;
  Token TVar3;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  SolveBeforeConstraintSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->solve).kind = (undefined2)local_28;
    (this->solve).field_0x2 = local_28._2_1_;
    (this->solve).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->solve).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->solve).info = local_20;
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (pSVar1);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=(&this->beforeExpr,pSVar2);
    break;
  case 2:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->before).kind = (undefined2)local_38;
    (this->before).field_0x2 = local_38._2_1_;
    (this->before).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->before).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->before).info = local_30;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>>
                       (pSVar1);
    SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator=(&this->afterExpr,pSVar2);
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_48;
    (this->semi).field_0x2 = local_48._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->semi).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->semi).info = local_40;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x2ea5);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void SolveBeforeConstraintSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: solve = child.token(); return;
        case 1: beforeExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 2: before = child.token(); return;
        case 3: afterExpr = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 4: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}